

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O1

void __thiscall
ClCommandLine_SingleLetterBooleanOptions_Test::~ClCommandLine_SingleLetterBooleanOptions_Test
          (ClCommandLine_SingleLetterBooleanOptions_Test *this)

{
  anon_unknown.dwarf_26ec6::ClCommandLine::~ClCommandLine(&this->super_ClCommandLine);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_F (ClCommandLine, SingleLetterBooleanOptions) {
    opt<bool> opt_a ("a");
    opt<bool> opt_b ("b");
    opt<bool> opt_c ("c");
    EXPECT_EQ (opt_a.get (), false);
    EXPECT_EQ (opt_b.get (), false);
    EXPECT_EQ (opt_c.get (), false);

    this->add ("progname", "-ab");

    string_stream output;
    string_stream errors;
    bool const res = this->parse_command_line_options (output, errors);
    EXPECT_TRUE (res);
    EXPECT_EQ (errors.str ().length (), 0U);
    EXPECT_EQ (output.str ().length (), 0U);

    EXPECT_EQ (opt_a.get (), true);
    EXPECT_EQ (opt_a.get_num_occurrences (), 1U);

    EXPECT_EQ (opt_b.get (), true);
    EXPECT_EQ (opt_b.get_num_occurrences (), 1U);

    EXPECT_EQ (opt_c.get (), false);
    EXPECT_EQ (opt_c.get_num_occurrences (), 0U);
}